

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddCacheIdToPropertyIdMap
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  uint32 uVar1;
  PropertyId PVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint i;
  uint cacheId;
  
  uVar1 = FunctionBody::GetCountField(function,InlineCacheCount);
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    cacheId = 0;
    uVar4 = 0;
    do {
      PVar2 = FunctionBody::GetPropertyIdFromCacheId(function,cacheId);
      PVar2 = encodePossiblyBuiltInPropertyId(this,PVar2);
      uVar3 = PrependInt32(this,builder,L"CacheIdToPropertyId",PVar2,(BufferBuilderInt32 **)0x0);
      uVar4 = uVar4 + uVar3;
      cacheId = cacheId + 1;
    } while (uVar1 != cacheId);
  }
  return uVar4;
}

Assistant:

uint32 AddCacheIdToPropertyIdMap(BufferBuilderList & builder, FunctionBody * function)
    {
        uint count = function->GetInlineCacheCount();
        if (count == 0)
        {
            return 0;
        }
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start CacheId-to-PropertyId map"), magicStartOfCacheIdToPropIdMap);
#endif

        for (uint i = 0; i < count; i++)
        {
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(function->GetPropertyIdFromCacheId(i));
            size += PrependInt32(builder, _u("CacheIdToPropertyId"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End CacheId-to-PropertyId map"), magicEndOfCacheIdToPropIdMap);
#endif

        return size;
    }